

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O2

string * __thiscall
Catch::Detail::rawMemoryToString_abi_cxx11_
          (string *__return_storage_ptr__,Detail *this,void *object,size_t size)

{
  long lVar1;
  bool bVar2;
  ReusableStringStream rss;
  
  ReusableStringStream::ReusableStringStream(&rss);
  std::operator<<((ostream *)rss.m_oss,"0x");
  std::operator<<(rss.m_oss,0x30);
  *(uint *)(rss.m_oss + *(long *)(*(long *)rss.m_oss + -0x18) + 0x18) =
       *(uint *)(rss.m_oss + *(long *)(*(long *)rss.m_oss + -0x18) + 0x18) & 0xffffffb5 | 8;
  lVar1 = (long)(int)object;
  while (bVar2 = lVar1 != 0, lVar1 = lVar1 + -1, bVar2) {
    *(undefined8 *)(rss.m_oss + *(long *)(*(long *)rss.m_oss + -0x18) + 0x10) = 2;
    std::ostream::_M_insert<unsigned_long>((ulong)rss.m_oss);
  }
  std::__cxx11::stringbuf::str();
  ReusableStringStream::~ReusableStringStream(&rss);
  return __return_storage_ptr__;
}

Assistant:

std::string rawMemoryToString( const void *object, std::size_t size ) {
        // Reverse order for little endian architectures
        int i = 0, end = static_cast<int>( size ), inc = 1;
        if( Endianness::which() == Endianness::Little ) {
            i = end-1;
            end = inc = -1;
        }

        unsigned char const *bytes = static_cast<unsigned char const *>(object);
        ReusableStringStream rss;
        rss << "0x" << std::setfill('0') << std::hex;
        for( ; i != end; i += inc )
             rss << std::setw(2) << static_cast<unsigned>(bytes[i]);
       return rss.str();
    }